

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item.hpp
# Opt level: O0

Item * __thiscall ItemGolds::gold_value(ItemGolds *this,uint16_t value)

{
  Item *pIVar1;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  uint16_t local_12;
  ItemGolds *pIStack_10;
  uint16_t value_local;
  ItemGolds *this_local;
  
  local_12 = value;
  pIStack_10 = this;
  std::__cxx11::to_string(&local_58,(uint)value);
  std::operator+(&local_38,&local_58," golds");
  Item::name(&this->super_Item,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  pIVar1 = Item::gold_value(&this->super_Item,local_12);
  return pIVar1;
}

Assistant:

Item& gold_value(uint16_t value) override
    {
        this->name(std::to_string(value) + " golds");
        return Item::gold_value(value);
    }